

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

int is_filter_search_enabled_blk
              (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,int segment_id,
              int cb_pred_filter_search,InterpFilter *filt_select)

{
  byte bVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  int in_R9D;
  int bsl;
  int enable_interp_search;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  uint in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  uint local_4;
  
  if (*(int *)(in_RDI + 0x60cd8) == 0) {
    local_4 = 0;
  }
  else if (bsl == 0) {
    local_4 = 1;
  }
  else {
    uVar3 = 0;
    if ((*(long *)(in_RSI + 0x2068) == 0) || (*(long *)(in_RSI + 0x2070) == 0)) {
      local_4 = 2;
    }
    else {
      iVar2 = is_inter_block((MB_MODE_INFO *)(ulong)in_stack_ffffffffffffffc0);
      if ((iVar2 == 0) ||
         (iVar2 = is_inter_block((MB_MODE_INFO *)CONCAT44(uVar3,in_stack_ffffffffffffffc0)),
         iVar2 == 0)) {
        local_4 = 2;
      }
      else if (*(int *)(*(long *)(in_RSI + 0x2068) + 0x14) ==
               *(int *)(*(long *)(in_RSI + 0x2070) + 0x14)) {
        if ((bsl == 1) && (*(short *)(*(long *)(in_RSI + 0x2068) + 0x16) != 0)) {
          local_4 = 2;
        }
        else {
          if (*(short *)(*(long *)(in_RSI + 0x2068) + 0x16) == 1) {
            *(undefined1 *)&xd->mi_row = 1;
          }
          bVar1 = ""[in_R8B];
          iVar2 = get_chessboard_index(*(int *)(in_RDI + 0x3bf90));
          local_4 = (uint)(((in_EDX + in_ECX >> (bVar1 & 0x1f)) + iVar2 & 1U) != 0);
          iVar2 = cyclic_refresh_segment_id_boosted(in_R9D);
          if (iVar2 != 0) {
            local_4 = 1;
          }
        }
      }
      else {
        local_4 = 2;
      }
    }
  }
  return local_4;
}

Assistant:

static inline int is_filter_search_enabled_blk(AV1_COMP *cpi, MACROBLOCK *x,
                                               int mi_row, int mi_col,
                                               BLOCK_SIZE bsize, int segment_id,
                                               int cb_pred_filter_search,
                                               InterpFilter *filt_select) {
  const AV1_COMMON *const cm = &cpi->common;
  // filt search disabled
  if (!cpi->sf.rt_sf.use_nonrd_filter_search) return 0;
  // filt search purely based on mode properties
  if (!cb_pred_filter_search) return 1;
  MACROBLOCKD *const xd = &x->e_mbd;
  int enable_interp_search = 0;
  if (!(xd->left_mbmi && xd->above_mbmi)) {
    // neighbors info unavailable
    enable_interp_search = 2;
  } else if (!(is_inter_block(xd->left_mbmi) &&
               is_inter_block(xd->above_mbmi))) {
    // neighbor is INTRA
    enable_interp_search = 2;
  } else if (xd->left_mbmi->interp_filters.as_int !=
             xd->above_mbmi->interp_filters.as_int) {
    // filters are different
    enable_interp_search = 2;
  } else if ((cb_pred_filter_search == 1) &&
             (xd->left_mbmi->interp_filters.as_filters.x_filter !=
              EIGHTTAP_REGULAR)) {
    // not regular
    enable_interp_search = 2;
  } else {
    // enable prediction based on chessboard pattern
    if (xd->left_mbmi->interp_filters.as_filters.x_filter == EIGHTTAP_SMOOTH)
      *filt_select = EIGHTTAP_SMOOTH;
    const int bsl = mi_size_wide_log2[bsize];
    enable_interp_search =
        (bool)((((mi_row + mi_col) >> bsl) +
                get_chessboard_index(cm->current_frame.frame_number)) &
               0x1);
    if (cyclic_refresh_segment_id_boosted(segment_id)) enable_interp_search = 1;
  }
  return enable_interp_search;
}